

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestCoverageHandler::StartCoverageLogFile
          (cmCTestCoverageHandler *this,cmGeneratedFileStream *covLogFile,int logFileCount)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  string local_768 [32];
  ostringstream local_748 [8];
  ostringstream cmCTestLog_msg_1;
  string local_5d0 [48];
  ostringstream local_5a0 [8];
  ostringstream cmCTestLog_msg;
  char local_428 [8];
  char covLogFilename [1024];
  int logFileCount_local;
  cmGeneratedFileStream *covLogFile_local;
  cmCTestCoverageHandler *this_local;
  
  covLogFilename._1020_4_ = logFileCount;
  sprintf(local_428,"CoverageLog-%d",(ulong)(uint)logFileCount);
  std::__cxx11::ostringstream::ostringstream(local_5a0);
  poVar3 = std::operator<<((ostream *)local_5a0,"Open file: ");
  poVar3 = std::operator<<(poVar3,local_428);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,4,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
               ,0x99,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string(local_5d0);
  std::__cxx11::ostringstream::~ostringstream(local_5a0);
  bVar2 = cmCTestGenericHandler::StartResultingXML
                    (&this->super_cmCTestGenericHandler,PartCoverage,local_428,covLogFile);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_748);
    poVar3 = std::operator<<((ostream *)local_748,"Cannot open log file: ");
    poVar3 = std::operator<<(poVar3,local_428);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,6,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x9d,pcVar4,false);
    std::__cxx11::string::~string(local_768);
    std::__cxx11::ostringstream::~ostringstream(local_748);
  }
  return bVar2;
}

Assistant:

bool cmCTestCoverageHandler::StartCoverageLogFile(
  cmGeneratedFileStream& covLogFile, int logFileCount)
{
  char covLogFilename[1024];
  sprintf(covLogFilename, "CoverageLog-%d", logFileCount);
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Open file: " << covLogFilename << std::endl,
                     this->Quiet);
  if (!this->StartResultingXML(cmCTest::PartCoverage, covLogFilename,
                               covLogFile)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot open log file: " << covLogFilename << std::endl);
    return false;
  }
  return true;
}